

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

Aig_Tru_t ** Aig_RManTableLookup(Aig_RMan_t *p,uint *pTruth,int nVars)

{
  Aig_Tru_t **ppAVar1;
  int iVar2;
  Aig_Tru_t *local_38;
  Aig_Tru_t *pEntry;
  Aig_Tru_t **ppSpot;
  int nVars_local;
  uint *pTruth_local;
  Aig_RMan_t *p_local;
  
  ppAVar1 = p->pBins;
  iVar2 = Aig_RManTableHash(pTruth,nVars,p->nBins,Aig_RManTableLookup::s_Primes);
  pEntry = (Aig_Tru_t *)(ppAVar1 + iVar2);
  local_38 = pEntry->pNext;
  while ((local_38 != (Aig_Tru_t *)0x0 &&
         (iVar2 = Kit_TruthIsEqual((uint *)(local_38 + 1),pTruth,nVars), iVar2 == 0))) {
    pEntry = local_38;
    local_38 = local_38->pNext;
  }
  return &pEntry->pNext;
}

Assistant:

Aig_Tru_t ** Aig_RManTableLookup( Aig_RMan_t * p, unsigned * pTruth, int nVars )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    Aig_Tru_t ** ppSpot, * pEntry;
    ppSpot = p->pBins + Aig_RManTableHash( pTruth, nVars, p->nBins, s_Primes );
    for ( pEntry = *ppSpot; pEntry; ppSpot = &pEntry->pNext, pEntry = pEntry->pNext )
        if ( Kit_TruthIsEqual( pEntry->pTruth, pTruth, nVars ) )
            return ppSpot;
    return ppSpot;
}